

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O0

ValueCallback *
ValueCallback::findCallback
          (deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,OIDType *oid,
          bool walk,size_t startAt,size_t *foundAt)

{
  bool bVar1;
  bool bVar2;
  value_type pVVar3;
  reference ppVVar4;
  value_type callback;
  size_t i;
  bool useNext;
  size_t *foundAt_local;
  size_t startAt_local;
  bool walk_local;
  OIDType *oid_local;
  deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks_local;
  
  bVar1 = false;
  callback = (value_type)startAt;
  while( true ) {
    pVVar3 = (value_type)
             Catch::clara::std::deque<ValueCallback_*,_std::allocator<ValueCallback_*>_>::size
                       ((deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *)callbacks);
    if (pVVar3 <= callback) {
      return (ValueCallback *)0x0;
    }
    ppVVar4 = std::deque<ValueCallback_*,_std::allocator<ValueCallback_*>_>::operator[]
                        (callbacks,(size_type)callback);
    pVVar3 = *ppVVar4;
    if (bVar1) break;
    bVar2 = OIDType::equals(oid,&pVVar3->OID->super_OIDType);
    if (bVar2) {
      if (!walk) {
        if (foundAt == (size_t *)0x0) {
          return pVVar3;
        }
        *foundAt = (size_t)callback;
        return pVVar3;
      }
      bVar1 = true;
    }
    else if ((walk) && (bVar2 = OIDType::isSubTreeOf(&pVVar3->OID->super_OIDType,oid), bVar2)) {
      if (foundAt == (size_t *)0x0) {
        return pVVar3;
      }
      *foundAt = (size_t)callback;
      return pVVar3;
    }
    callback = (value_type)((long)&callback->_vptr_ValueCallback + 1);
  }
  if (foundAt == (size_t *)0x0) {
    return pVVar3;
  }
  *foundAt = (size_t)callback;
  return pVVar3;
}

Assistant:

ValueCallback* ValueCallback::findCallback(std::deque<ValueCallback*> &callbacks, const OIDType* const oid, bool walk, size_t startAt, size_t *foundAt){
    bool useNext = false;

    for(size_t i = startAt; i < callbacks.size(); i++){
        auto callback = callbacks[i];

        if(useNext){
            if(foundAt){
                *foundAt = i;
            }
            return callback;
        }

        if(oid->equals(callback->OID)){
            if(walk){
                useNext = true;
                continue;
            }
            if(foundAt){
                *foundAt = i;
            }
            return callback;
        }

        if(walk && callback->OID->isSubTreeOf(oid)){
            // If the oid passed in is a substring of our current callback, and it begins at the start
            if(foundAt){
                *foundAt = i;
            }
            return callback;
        }
    }
    return nullptr;
}